

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::Clear(UniDirectionalLSTMLayerParams *this)

{
  InternalMetadata *this_00;
  LSTMParams *this_01;
  ulong uVar1;
  LSTMWeightParams *this_02;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase);
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  uVar3 = uVar3 & 1;
  puVar4 = puVar2;
  if (uVar3 != 0) {
    puVar4 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar4 == (undefined8 *)0x0) && (this_01 = this->params_, this_01 != (LSTMParams *)0x0)) {
    LSTMParams::~LSTMParams(this_01);
    operator_delete(this_01,0x20);
    uVar1 = this_00->ptr_;
    uVar3 = (ulong)((uint)uVar1 & 1);
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  }
  this->params_ = (LSTMParams *)0x0;
  if (uVar3 != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_02 = this->weightparams_, this_02 != (LSTMWeightParams *)0x0)) {
    LSTMWeightParams::~LSTMWeightParams(this_02);
    operator_delete(this_02,0x90);
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 1) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 1) = 0;
  this->weightparams_ = (LSTMWeightParams *)0x0;
  this->inputvectorsize_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>(this_00);
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  activations_.Clear();
  if (GetArenaForAllocation() == nullptr && params_ != nullptr) {
    delete params_;
  }
  params_ = nullptr;
  if (GetArenaForAllocation() == nullptr && weightparams_ != nullptr) {
    delete weightparams_;
  }
  weightparams_ = nullptr;
  ::memset(&inputvectorsize_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&reverseinput_) -
      reinterpret_cast<char*>(&inputvectorsize_)) + sizeof(reverseinput_));
  _internal_metadata_.Clear<std::string>();
}